

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O3

bool __thiscall
QPDFObjectHandle::pipeStreamData
          (QPDFObjectHandle *this,Pipeline *p,bool filter,bool normalize,bool compress)

{
  bool bVar1;
  qpdf_stream_decode_level_e decode_level;
  undefined7 in_register_00000009;
  int encode_flags;
  undefined7 in_register_00000011;
  undefined7 in_register_00000081;
  
  encode_flags = (int)CONCAT71(in_register_00000081,compress) +
                 (int)CONCAT71(in_register_00000009,normalize) * 2;
  decode_level = (qpdf_stream_decode_level_e)CONCAT71(in_register_00000011,filter);
  if (decode_level == qpdf_dl_none) {
    encode_flags = 0;
  }
  bVar1 = pipeStreamData(this,p,encode_flags,decode_level,false,false);
  return bVar1;
}

Assistant:

bool
QPDFObjectHandle::pipeStreamData(Pipeline* p, bool filter, bool normalize, bool compress)
{
    int encode_flags = 0;
    qpdf_stream_decode_level_e decode_level = qpdf_dl_none;
    if (filter) {
        decode_level = qpdf_dl_generalized;
        if (normalize) {
            encode_flags |= qpdf_ef_normalize;
        }
        if (compress) {
            encode_flags |= qpdf_ef_compress;
        }
    }
    return pipeStreamData(p, encode_flags, decode_level, false);
}